

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Geometry.cpp
# Opt level: O0

void __thiscall TRM::Vertex::insert_above(Vertex *this,Edge *e)

{
  bool bVar1;
  Edge *local_28;
  Edge *above_next;
  Edge *above_prev;
  Edge *e_local;
  Vertex *this_local;
  
  bVar1 = glm::operator==(&e->top->point,&e->bottom->point);
  if ((!bVar1) && (bVar1 = VertexCompare::Compare(&e->bottom->point,&e->top->point), !bVar1)) {
    above_next = (Edge *)0x0;
    local_28 = (this->edge_above).head;
    while ((local_28 != (Edge *)0x0 && (bVar1 = Edge::is_right_of(local_28,&e->top->point), !bVar1))
          ) {
      above_next = local_28;
      local_28 = local_28->above_next;
    }
    LinkedList<TRM::Edge>::Insert<&TRM::Edge::above_prev,&TRM::Edge::above_next>
              (e,above_next,local_28,&(this->edge_above).head,&(this->edge_above).tail);
  }
  return;
}

Assistant:

void Vertex::insert_above(Edge* e) {
  if (e->top->point == e->bottom->point ||                     // no edge
      VertexCompare::Compare(e->bottom->point, e->top->point)  // not above
  ) {
    return;
  }

  Edge* above_prev = nullptr;
  Edge* above_next = nullptr;

  for (above_next = edge_above.head; above_next != nullptr;
       above_next = above_next->above_next) {
    if (above_next->is_right_of(e->top->point)) {
      break;
    }

    above_prev = above_next;
  }

  LinkedList<Edge>::Insert<&Edge::above_prev, &Edge::above_next>(
      e, above_prev, above_next, &edge_above.head, &edge_above.tail);
}